

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::FormulasLoader15::begin__logbase(FormulasLoader15 *this)

{
  logbase__AttributeData *in_stack_00000148;
  FormulasLoader15 *in_stack_00000150;
  
  begin__logbase(in_stack_00000150,in_stack_00000148);
  return;
}

Assistant:

bool FormulasLoader15::begin__logbase( const COLLADASaxFWL15::logbase__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__logbase(attributeData));
COLLADASaxFWL::logbase__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::logbase__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::logbase__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::logbase__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::logbase__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::logbase__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::logbase__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__logbase(attrData);
}